

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O0

bool __thiscall State::moveLeft(State *this,State *s)

{
  State *this_00;
  bool bVar1;
  State *s_local;
  State *this_local;
  
  bVar1 = (this->blank).width != 0;
  if (bVar1) {
    operator=(s,this);
    moveY(s,-1);
    this_00 = (State *)operator_new(0x28);
    State(this_00,this);
    s->previous = this_00;
  }
  return bVar1;
}

Assistant:

bool State::moveLeft(State &s) {
    if (blank.width == 0) {
        return false;
    }

    s = *this;
    s.moveY(-1);
    s.previous = new State(*this);
    return true;
}